

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

example * __thiscall example_initializer::operator()(example_initializer *this,example *ex)

{
  (ex->l).cs.costs.end_array = (wclass *)0x0;
  (ex->l).cs.costs.erase_count = 0;
  (ex->l).cs.costs._begin = (wclass *)0x0;
  (ex->l).cs.costs._end = (wclass *)0x0;
  (ex->l).cb_eval.event.costs.erase_count = 0;
  ex->in_use = false;
  ex->passthrough = (features *)0x0;
  (ex->tag)._begin = (char *)0x0;
  (ex->tag)._end = (char *)0x0;
  (ex->tag).end_array = (char *)0x0;
  (ex->tag).erase_count = 0;
  (ex->super_example_predict).indices._begin = (uchar *)0x0;
  (ex->super_example_predict).indices._end = (uchar *)0x0;
  (ex->super_example_predict).indices.end_array = (uchar *)0x0;
  (ex->super_example_predict).indices.erase_count = 0;
  memset((ex->super_example_predict).feature_space,0,0x6800);
  return ex;
}

Assistant:

example* example_initializer::operator()(example* ex)
{
  memset(&ex->l, 0, sizeof(polylabel));
  ex->in_use = false;
  ex->passthrough = nullptr;
  ex->tag = v_init<char>();
  ex->indices = v_init<namespace_index>();
  memset(&ex->feature_space, 0, sizeof(ex->feature_space));
  return ex;
}